

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Audio.cpp
# Opt level: O0

void __thiscall Amiga::Audio::output(Audio *this)

{
  char cVar1;
  char cVar2;
  bool bVar3;
  size_type sVar4;
  bool bVar5;
  reference pvVar6;
  size_type sVar7;
  anon_class_24_3_5e880ab1 local_88;
  function<void_()> local_70;
  atomic<bool> *local_50;
  atomic<bool> *flag;
  AudioBuffer *buffer;
  Channel *pCStack_38;
  int c;
  Channel *modulands [4];
  FlagT interrupts [4];
  Audio *this_local;
  
  modulands[3] = (Channel *)0x400020001000080;
  pCStack_38 = this->channels_ + 1;
  modulands[0] = this->channels_ + 2;
  modulands[1] = this->channels_ + 3;
  modulands[2] = (Channel *)0x0;
  for (buffer._4_4_ = 0; buffer._4_4_ < 4; buffer._4_4_ = buffer._4_4_ + 1) {
    bVar5 = Channel::output(this->channels_ + buffer._4_4_,modulands[(long)buffer._4_4_ + -1]);
    if (bVar5) {
      DMADeviceBase::posit_interrupt((DMADeviceBase *)this,interrupts[(long)buffer._4_4_ + -4]);
    }
  }
  if (this->sample_pointer_ == 0) {
    do {
      bVar5 = std::atomic<bool>::load
                        (this->buffer_available_ + this->buffer_pointer_,memory_order_relaxed);
    } while (((bVar5 ^ 0xffU) & 1) != 0);
  }
  cVar1 = this->channels_[1].output_level;
  bVar5 = this->channels_[1].output_enabled;
  cVar2 = this->channels_[2].output_level;
  bVar3 = this->channels_[2].output_enabled;
  pvVar6 = std::array<short,_4096UL>::operator[]
                     (this->buffer_ + this->buffer_pointer_,this->sample_pointer_);
  *pvVar6 = ((short)cVar1 * (ushort)(bVar5 & 1) + (short)cVar2 * (ushort)(bVar3 & 1)) * 0x80;
  cVar1 = this->channels_[0].output_level;
  bVar5 = this->channels_[0].output_enabled;
  cVar2 = this->channels_[3].output_level;
  bVar3 = this->channels_[3].output_enabled;
  pvVar6 = std::array<short,_4096UL>::operator[]
                     (this->buffer_ + this->buffer_pointer_,this->sample_pointer_ + 1);
  *pvVar6 = ((short)cVar1 * (ushort)(bVar5 & 1) + (short)cVar2 * (ushort)(bVar3 & 1)) * 0x80;
  this->sample_pointer_ = this->sample_pointer_ + 2;
  sVar4 = this->sample_pointer_;
  sVar7 = std::array<short,_4096UL>::size(this->buffer_ + this->buffer_pointer_);
  if (sVar4 == sVar7) {
    flag = (atomic<bool> *)(this->buffer_ + this->buffer_pointer_);
    local_50 = this->buffer_available_ + this->buffer_pointer_;
    std::atomic<bool>::store(local_50,false,memory_order_release);
    local_88.buffer = (AudioBuffer *)flag;
    local_88.flag = local_50;
    local_88.this = this;
    std::function<void()>::function<Amiga::Audio::output()::__0,void>
              ((function<void()> *)&local_70,&local_88);
    Concurrency::AsyncTaskQueue<true,_true,_void>::enqueue(&this->queue_,&local_70);
    std::function<void_()>::~function(&local_70);
    this->buffer_pointer_ = (this->buffer_pointer_ + 1) % 3;
    this->sample_pointer_ = 0;
  }
  return;
}

Assistant:

void Audio::output() {
	constexpr InterruptFlag::FlagT interrupts[] = {
		InterruptFlag::AudioChannel0,
		InterruptFlag::AudioChannel1,
		InterruptFlag::AudioChannel2,
		InterruptFlag::AudioChannel3,
	};
	Channel *const modulands[] = {
		&channels_[1],
		&channels_[2],
		&channels_[3],
		nullptr,
	};

	for(int c = 0; c < 4; c++) {
		if(channels_[c].output(modulands[c])) {
			posit_interrupt(interrupts[c]);
		}
	}

	// Spin until the next buffer is available if just entering it for the first time.
	// Contention here should be essentially non-existent.
	if(!sample_pointer_) {
		while(!buffer_available_[buffer_pointer_].load(std::memory_order::memory_order_relaxed));
	}

	// Left.
	static_assert(std::tuple_size<AudioBuffer>::value % 2 == 0);
	buffer_[buffer_pointer_][sample_pointer_] = int16_t(
		(
			channels_[1].output_level * channels_[1].output_enabled +
			channels_[2].output_level * channels_[2].output_enabled
		) << 7
	);

	// Right.
	buffer_[buffer_pointer_][sample_pointer_ + 1] = int16_t(
		(
			channels_[0].output_level * channels_[0].output_enabled +
			channels_[3].output_level * channels_[3].output_enabled
		) << 7
	);
	sample_pointer_ += 2;

	if(sample_pointer_ == buffer_[buffer_pointer_].size()) {
		const auto &buffer = buffer_[buffer_pointer_];
		auto &flag = buffer_available_[buffer_pointer_];

		flag.store(false, std::memory_order::memory_order_release);
		queue_.enqueue([this, &buffer, &flag] {
			speaker_.push(buffer.data(), buffer.size() >> 1);
			flag.store(true, std::memory_order::memory_order_relaxed);
		});

		buffer_pointer_ = (buffer_pointer_ + 1) % BufferCount;
		sample_pointer_ = 0;
	}
}